

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O3

string * bf_crc::number_to_str_abi_cxx11_(uint64_t v)

{
  ulong in_RSI;
  string_type *in_RDI;
  format f;
  ulong local_120;
  undefined1 local_118 [224];
  ulong local_38;
  put_holder<char,_std::char_traits<char>_> local_30;
  
  if (in_RSI < 1000) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,"%1%")
    ;
    local_30.arg = &local_38;
    local_30.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_long>;
    local_30.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_long>;
    boost::io::detail::
    feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               &local_30);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,local_118);
  }
  else if (in_RSI < 1000000) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,"%1%k"
              );
    local_120 = (in_RSI & 0xffffffff) / 1000;
    local_30.arg = &local_120;
    local_30.put_head =
         boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_long_const>;
    local_30.put_last =
         boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_long_const>;
    boost::io::detail::
    feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               &local_30);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,local_118);
  }
  else if (in_RSI < 1000000000) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,"%1%M"
              );
    local_120 = (in_RSI & 0xffffffff) / 1000000;
    local_30.arg = &local_120;
    local_30.put_head =
         boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_long_const>;
    local_30.put_last =
         boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_long_const>;
    boost::io::detail::
    feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               &local_30);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,local_118);
  }
  else if (in_RSI >> 0xc < 0xe8d4a51) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,"%1%B"
              );
    local_120 = in_RSI / 1000000000;
    local_30.arg = &local_120;
    local_30.put_head =
         boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_long_const>;
    local_30.put_last =
         boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_long_const>;
    boost::io::detail::
    feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               &local_30);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,local_118);
  }
  else {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,"%1%T"
              );
    local_120 = in_RSI / 1000000000000;
    local_30.arg = &local_120;
    local_30.put_head =
         boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_long_const>;
    local_30.put_last =
         boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_long_const>;
    boost::io::detail::
    feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               &local_30);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_RDI,local_118);
  }
  if (local_118[0xd0] == true) {
    std::locale::~locale((locale *)(local_118 + 0xd8));
    local_118[0xd0] = false;
  }
  boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
  ~basic_altstringbuf((basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_118 + 0x78));
  if ((undefined1 *)local_118._80_8_ != local_118 + 0x60) {
    operator_delete((void *)local_118._80_8_,local_118._96_8_ + 1);
  }
  if ((_Bit_type *)local_118._24_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_118._24_8_,local_118._56_8_ - local_118._24_8_);
    local_118._24_8_ = (_Bit_type *)0x0;
    local_118._32_4_ = 0;
    local_118._40_8_ = (_Bit_type *)0x0;
    local_118._48_4_ = 0;
    local_118._56_8_ = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118);
  return in_RDI;
}

Assistant:

std::string bf_crc::number_to_str(uint64_t v) {
  if(v < 1000) {
    boost::format f("%1%");
    f % v;
    return f.str();
  }
  else if(v < 1000*1000) {
    boost::format f("%1%k");
    f % (v/1000);
    return f.str();
  }
  else if(v < 1000*1000*1000) {
    boost::format f("%1%M");
    f % (v/1000000);
    return f.str();
  }
  else if(v < 1000*1000*1000*1000L) {
    boost::format f("%1%B");
    f % (v/1000000000L);
    return f.str();
  }
  else {
    boost::format f("%1%T");
    f % (v/1000000000000);
    return f.str();
  }
  
}